

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O2

void __thiscall XPMP2::SoundSystemFMOD::SetMute(SoundSystemFMOD *this,uint64_t sndId,bool bMute)

{
  FMOD_RESULT _r;
  SoundChannel *pSVar1;
  allocator<char> local_cb;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  FmodError local_68;
  
  pSVar1 = SoundSystem::GetChn(&this->super_SoundSystem,sndId);
  if ((pSVar1 != (SoundChannel *)0x0) && (pSVar1->pChn != (FMOD_CHANNEL *)0x0)) {
    pSVar1->bMuted = bMute;
    gFmodRes = FMOD_Channel_SetMute(pSVar1->pChn,bMute);
    if (gFmodRes != FMOD_OK) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"FMOD_Channel_SetMute(pChn->pChn, bMute)",&local_c9);
      _r = gFmodRes;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,&local_ca);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"SetMute",&local_cb);
      FmodError::FmodError(&local_68,&local_88,_r,&local_a8,0x195,&local_c8);
      FmodError::LogErr(&local_68);
      FmodError::~FmodError(&local_68);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetMute (uint64_t sndId, bool bMute)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn || !pChn->pChn) return;

    pChn->bMuted = bMute;                   // Save its mute status
    FMOD_LOG(FMOD_Channel_SetMute(pChn->pChn, bMute));
}